

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ItemSize(ImVec2 *size,float text_baseline_y)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 IVar10;
  float fVar11;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if (pIVar2->SkipItems == false) {
    fVar7 = 0.0;
    fVar1 = (pIVar2->DC).CurrLineTextBaseOffset;
    if (0.0 <= text_baseline_y) {
      fVar7 = (float)(~-(uint)(fVar1 - text_baseline_y <= 0.0) & (uint)(fVar1 - text_baseline_y));
    }
    fVar7 = fVar7 + size->y;
    fVar9 = (pIVar2->DC).CurrLineSize.y;
    uVar4 = -(uint)(fVar7 <= fVar9);
    fVar6 = (float)(uVar4 & (uint)fVar9 | ~uVar4 & (uint)fVar7);
    fVar8 = (pIVar2->DC).CursorPos.x + size->x;
    (pIVar2->DC).CursorPosPrevLine.x = fVar8;
    fVar7 = (pIVar2->DC).CursorPos.y;
    (pIVar2->DC).CursorPosPrevLine.y = fVar7;
    fVar9 = (pIVar3->Style).ItemSpacing.y;
    IVar10.x = (float)(int)((pIVar2->DC).ColumnsOffset.x + (pIVar2->DC).Indent.x + (pIVar2->Pos).x);
    IVar10.y = (float)(int)(fVar9 + fVar7 + fVar6);
    (pIVar2->DC).CursorPos = IVar10;
    fVar9 = IVar10.y - fVar9;
    IVar10 = (pIVar2->DC).CursorMaxPos;
    fVar7 = IVar10.x;
    fVar11 = IVar10.y;
    uVar4 = -(uint)(fVar8 <= fVar7);
    uVar5 = -(uint)(fVar9 <= fVar11);
    (pIVar2->DC).CursorMaxPos =
         (ImVec2)(CONCAT44(~uVar5 & (uint)fVar9,~uVar4 & (uint)fVar8) |
                 CONCAT44((uint)fVar11 & uVar5,(uint)fVar7 & uVar4));
    (pIVar2->DC).PrevLineSize.y = fVar6;
    (pIVar2->DC).CurrLineSize.y = 0.0;
    (pIVar2->DC).PrevLineTextBaseOffset =
         (float)(~-(uint)(text_baseline_y <= fVar1) & (uint)text_baseline_y |
                (uint)fVar1 & -(uint)(text_baseline_y <= fVar1));
    (pIVar2->DC).CurrLineTextBaseOffset = 0.0;
    if ((pIVar2->DC).LayoutType == 0) {
      SameLine(0.0,-1.0);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ItemSize(const ImVec2& size, float text_baseline_y)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    // We increase the height in this function to accommodate for baseline offset.
    // In theory we should be offsetting the starting position (window->DC.CursorPos), that will be the topic of a larger refactor,
    // but since ItemSize() is not yet an API that moves the cursor (to handle e.g. wrapping) enlarging the height has the same effect.
    const float offset_to_match_baseline_y = (text_baseline_y >= 0) ? ImMax(0.0f, window->DC.CurrLineTextBaseOffset - text_baseline_y) : 0.0f;
    const float line_height = ImMax(window->DC.CurrLineSize.y, size.y + offset_to_match_baseline_y);

    // Always align ourselves on pixel boundaries
    //if (g.IO.KeyAlt) window->DrawList->AddRect(window->DC.CursorPos, window->DC.CursorPos + ImVec2(size.x, line_height), IM_COL32(255,0,0,200)); // [DEBUG]
    window->DC.CursorPosPrevLine.x = window->DC.CursorPos.x + size.x;
    window->DC.CursorPosPrevLine.y = window->DC.CursorPos.y;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);    // Next line
    window->DC.CursorPos.y = IM_FLOOR(window->DC.CursorPos.y + line_height + g.Style.ItemSpacing.y);        // Next line
    window->DC.CursorMaxPos.x = ImMax(window->DC.CursorMaxPos.x, window->DC.CursorPosPrevLine.x);
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, window->DC.CursorPos.y - g.Style.ItemSpacing.y);
    //if (g.IO.KeyAlt) window->DrawList->AddCircle(window->DC.CursorMaxPos, 3.0f, IM_COL32(255,0,0,255), 4); // [DEBUG]

    window->DC.PrevLineSize.y = line_height;
    window->DC.CurrLineSize.y = 0.0f;
    window->DC.PrevLineTextBaseOffset = ImMax(window->DC.CurrLineTextBaseOffset, text_baseline_y);
    window->DC.CurrLineTextBaseOffset = 0.0f;

    // Horizontal layout mode
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
        SameLine();
}